

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O1

int Of_SetAddCut(Of_Cut_t **pCuts,int nCuts,int nCutNum)

{
  uint uVar1;
  Of_Cut_t *pOVar2;
  Of_Cut_t *pOVar3;
  bool bVar4;
  int iVar5;
  Of_Cut_t *t;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  
  if (nCuts == 0) {
    return 1;
  }
  if (0 < nCuts) {
    uVar6 = 0;
    bVar4 = false;
    do {
      pOVar2 = pCuts[(uint)nCuts];
      uVar7 = *(uint *)&pOVar2->field_0x10 >> 0x1b;
      pOVar3 = pCuts[uVar6];
      uVar1 = *(uint *)&pOVar3->field_0x10;
      uVar11 = uVar1 >> 0x1b;
      if ((uVar7 < uVar11) && ((pOVar2->Sign & ~pOVar3->Sign) == 0)) {
        if (uVar11 == uVar7) {
          if (0x7ffffff < uVar1) {
            uVar8 = 0;
            do {
              if (pOVar3->pLeaves[uVar8] != pOVar2->pLeaves[uVar8]) goto LAB_00750e54;
              uVar8 = uVar8 + 1;
            } while (uVar11 != uVar8);
          }
        }
        else if (0x7ffffff < *(uint *)&pOVar2->field_0x10) {
          uVar8 = 0;
          uVar9 = 0;
          do {
            if (pOVar2->pLeaves[(int)uVar9] < pOVar3->pLeaves[uVar8]) break;
            if ((pOVar3->pLeaves[uVar8] == pOVar2->pLeaves[(int)uVar9]) &&
               (uVar9 = uVar9 + 1, uVar9 == uVar7)) goto LAB_00750e43;
            uVar8 = uVar8 + 1;
          } while (uVar11 != uVar8);
          goto LAB_00750e54;
        }
LAB_00750e43:
        *(uint *)&pOVar3->field_0x10 = uVar1 | 0xf8000000;
        bVar4 = true;
      }
LAB_00750e54:
      uVar6 = uVar6 + 1;
    } while (uVar6 != (uint)nCuts);
    if (bVar4) {
      uVar6 = 0;
      iVar5 = 0;
      do {
        if (*(uint *)&pCuts[uVar6]->field_0x10 < 0xf8000000) {
          lVar10 = (long)iVar5;
          if (lVar10 < (long)uVar6) {
            pOVar2 = pCuts[lVar10];
            pCuts[lVar10] = pCuts[uVar6];
            pCuts[uVar6] = pOVar2;
          }
          iVar5 = iVar5 + 1;
        }
        uVar6 = uVar6 + 1;
      } while (nCuts + 1 != uVar6);
      nCuts = iVar5 - 1;
    }
  }
  uVar1 = nCuts;
  if (0 < nCuts) {
    while( true ) {
      pOVar2 = pCuts[(ulong)uVar1 - 1];
      pOVar3 = pCuts[uVar1];
      if (pOVar2->Delay < pOVar3->Delay) break;
      if (pOVar2->Delay <= pOVar3->Delay) {
        if ((pOVar2->Flow < pOVar3->Flow) ||
           ((pOVar2->Flow <= pOVar3->Flow &&
            (*(uint *)&pOVar2->field_0x10 >> 0x1b < *(uint *)&pOVar3->field_0x10 >> 0x1b)))) break;
      }
      pCuts[(ulong)uVar1 - 1] = pOVar3;
      pCuts[uVar1] = pOVar2;
      bVar4 = (int)uVar1 < 2;
      uVar1 = uVar1 - 1;
      if (bVar4) break;
    }
  }
  iVar5 = nCutNum + -1;
  if ((int)(nCuts + 1U) < nCutNum + -1) {
    iVar5 = nCuts + 1U;
  }
  return iVar5;
}

Assistant:

static inline int Of_SetAddCut( Of_Cut_t ** pCuts, int nCuts, int nCutNum )
{
    if ( nCuts == 0 )
        return 1;
    nCuts = Of_SetLastCutContainsArea(pCuts, nCuts);
    Of_SetSortByArea( pCuts, nCuts );
    return Abc_MinInt( nCuts + 1, nCutNum - 1 );
}